

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O3

void __thiscall google::protobuf::RepeatedField<long>::FastAdder::Add(FastAdder *this,long *val)

{
  RepeatedField<long> *this_00;
  long lVar1;
  long *plVar2;
  int iVar3;
  
  iVar3 = this->index_;
  if (iVar3 == this->capacity_) {
    this_00 = this->repeated_field_;
    this_00->current_size_ = iVar3;
    Reserve(this_00,iVar3 + 1);
    this->capacity_ = this->repeated_field_->total_size_;
    plVar2 = (long *)this->repeated_field_->arena_or_elements_;
    this->buffer_ = plVar2;
    iVar3 = this->index_;
  }
  else {
    plVar2 = this->buffer_;
  }
  lVar1 = *val;
  this->index_ = iVar3 + 1;
  plVar2[iVar3] = lVar1;
  return;
}

Assistant:

void Add(const Element& val) {
      if (kIsPod) {
        if (index_ == capacity_) {
          repeated_field_->current_size_ = index_;
          repeated_field_->Reserve(index_ + 1);
          capacity_ = repeated_field_->total_size_;
          buffer_ = repeated_field_->unsafe_elements();
        }
        buffer_[index_++] = val;
      } else {
        repeated_field_->Add(val);
      }
    }